

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode setup_range(Curl_easy *data)

{
  char *pcVar1;
  UrlState *s;
  Curl_easy *data_local;
  
  (data->state).resume_from = (data->set).set_resume_from;
  if (((data->state).resume_from == 0) && ((data->set).str[0x28] == (char *)0x0)) {
    *(uint *)&(data->state).field_0x7be = *(uint *)&(data->state).field_0x7be & 0xfffffbff;
  }
  else {
    if ((*(uint *)&(data->state).field_0x7be >> 0xb & 1) != 0) {
      (*Curl_cfree)((data->state).range);
    }
    if ((data->state).resume_from == 0) {
      pcVar1 = (*Curl_cstrdup)((data->set).str[0x28]);
      (data->state).range = pcVar1;
    }
    else {
      pcVar1 = curl_maprintf("%ld-",(data->state).resume_from);
      (data->state).range = pcVar1;
    }
    if ((data->state).range == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *(uint *)&(data->state).field_0x7be = *(uint *)&(data->state).field_0x7be & 0xfffff7ff | 0x800;
    *(uint *)&(data->state).field_0x7be = *(uint *)&(data->state).field_0x7be & 0xfffffbff | 0x400;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode setup_range(struct Curl_easy *data)
{
  struct UrlState *s = &data->state;
  s->resume_from = data->set.set_resume_from;
  if(s->resume_from || data->set.str[STRING_SET_RANGE]) {
    if(s->rangestringalloc)
      free(s->range);

    if(s->resume_from)
      s->range = aprintf("%" FMT_OFF_T "-", s->resume_from);
    else
      s->range = strdup(data->set.str[STRING_SET_RANGE]);

    if(!s->range)
      return CURLE_OUT_OF_MEMORY;

    s->rangestringalloc = TRUE;

    /* tell ourselves to fetch this range */
    s->use_range = TRUE;        /* enable range download */
  }
  else
    s->use_range = FALSE; /* disable range download */

  return CURLE_OK;
}